

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void AddInterfaceEntries(cmGeneratorTarget *thisTarget,string *config,string *prop,
                        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                        *entries)

{
  cmGeneratorTarget *gt;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  uVar1;
  cmLinkImplementationLibraries *pcVar2;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_118;
  vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
  *local_110;
  string *local_108;
  cmGeneratorTarget *local_100;
  pointer local_f8;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_e8;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  string uniqueName;
  string genex;
  
  local_110 = (vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
               *)entries;
  local_108 = prop;
  local_100 = thisTarget;
  pcVar2 = cmGeneratorTarget::GetLinkImplementationLibraries(thisTarget,config);
  if (pcVar2 != (cmLinkImplementationLibraries *)0x0) {
    local_f8 = (pcVar2->Libraries).
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
    p_Var3 = (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &(((pcVar2->Libraries).
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start)->super_cmLinkItem).Backtrace;
    while( true ) {
      if ((pointer)&p_Var3[-3]._M_refcount == local_f8) break;
      gt = (cmGeneratorTarget *)p_Var3[-1]._M_refcount._M_pi;
      if (gt != (cmGeneratorTarget *)0x0) {
        cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                  (&uniqueName,local_100->LocalGenerator->GlobalGenerator,gt);
        std::operator+(&local_d0,"$<TARGET_PROPERTY:",&uniqueName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cge,
                       &local_d0,",");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cge,
                       local_108);
        std::operator+(&genex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ge,">");
        local_e8 = &p_Var3[-3]._M_refcount;
        std::__cxx11::string::~string((string *)&ge);
        std::__cxx11::string::~string((string *)&cge);
        std::__cxx11::string::~string((string *)&local_d0);
        local_f0 = p_Var3;
        std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_e0,p_Var3);
        cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_e0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
        cmGeneratorExpression::Parse
                  ((cmGeneratorExpression *)&cge,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge);
        uVar1 = cge;
        *(undefined1 *)
         ((long)cge._M_t.
                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl + 0x168)
             = 1;
        local_d0._M_dataplus._M_p = (pointer)operator_new(0x28);
        cge._M_t.
        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
              )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                )0x0;
        *(__shared_count<(__gnu_cxx::_Lock_policy)2> **)(local_d0._M_dataplus._M_p + 8) = local_e8;
        local_d0._M_dataplus._M_p[0x10] = '\0';
        local_d0._M_dataplus._M_p[0x11] = '\0';
        local_d0._M_dataplus._M_p[0x12] = '\0';
        local_d0._M_dataplus._M_p[0x13] = '\0';
        local_d0._M_dataplus._M_p[0x14] = '\0';
        local_d0._M_dataplus._M_p[0x15] = '\0';
        local_d0._M_dataplus._M_p[0x16] = '\0';
        local_d0._M_dataplus._M_p[0x17] = '\0';
        local_d0._M_dataplus._M_p[0x18] = '\0';
        local_d0._M_dataplus._M_p[0x19] = '\0';
        local_d0._M_dataplus._M_p[0x1a] = '\0';
        local_d0._M_dataplus._M_p[0x1b] = '\0';
        local_d0._M_dataplus._M_p[0x1c] = '\0';
        local_d0._M_dataplus._M_p[0x1d] = '\0';
        local_d0._M_dataplus._M_p[0x1e] = '\0';
        local_d0._M_dataplus._M_p[0x1f] = '\0';
        *(undefined ***)local_d0._M_dataplus._M_p = &PTR__TargetPropertyEntryGenex_00562298;
        ((__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          *)(local_d0._M_dataplus._M_p + 0x20))->
        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             = (__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                )uVar1._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
        local_118._M_t.
        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
             (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                )0x0;
        std::
        vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
        ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
                  (local_110,(TargetPropertyEntry **)&local_d0);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                       *)&local_118);
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr(&cge);
        cmGeneratorExpression::~cmGeneratorExpression(&ge);
        std::__cxx11::string::~string((string *)&genex);
        std::__cxx11::string::~string((string *)&uniqueName);
        p_Var3 = local_f0;
      }
      p_Var3 = p_Var3 + 4;
    }
  }
  return;
}

Assistant:

static void AddInterfaceEntries(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::string const& prop,
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries)
{
  if (cmLinkImplementationLibraries const* impl =
        thisTarget->GetLinkImplementationLibraries(config)) {
    for (cmLinkImplItem const& lib : impl->Libraries) {
      if (lib.Target) {
        std::string uniqueName =
          thisTarget->GetGlobalGenerator()->IndexGeneratorTargetUniquely(
            lib.Target);
        std::string genex =
          "$<TARGET_PROPERTY:" + std::move(uniqueName) + "," + prop + ">";
        cmGeneratorExpression ge(lib.Backtrace);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(genex);
        cge->SetEvaluateForBuildsystem(true);
        entries.push_back(new TargetPropertyEntryGenex(std::move(cge), lib));
      }
    }
  }
}